

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

amrex_parser * amrex::amrex_parser_new(void)

{
  amrex_parser *paVar1;
  size_t sVar2;
  void *pvVar3;
  parser_node *ppVar4;
  char *unaff_retaddr;
  amrex_parser *my_parser;
  int in_stack_00000054;
  parser_node *in_stack_00000058;
  amrex_parser *in_stack_00000060;
  parser_node *in_stack_000000c0;
  parser_node *in_stack_000003a8;
  
  paVar1 = (amrex_parser *)malloc(0x20);
  sVar2 = parser_ast_size(in_stack_000000c0);
  paVar1->sz_mempool = sVar2;
  pvVar3 = malloc(paVar1->sz_mempool);
  paVar1->p_root = pvVar3;
  paVar1->p_free = paVar1->p_root;
  ppVar4 = parser_ast_dup(in_stack_00000060,in_stack_00000058,in_stack_00000054);
  paVar1->ast = ppVar4;
  if ((void *)((long)paVar1->p_root + paVar1->sz_mempool) != paVar1->p_free) {
    Abort_host(unaff_retaddr);
  }
  parser_ast_optimize(in_stack_000003a8);
  return paVar1;
}

Assistant:

struct amrex_parser*
amrex_parser_new ()
{
    auto my_parser = (struct amrex_parser*) std::malloc(sizeof(struct amrex_parser));

    my_parser->sz_mempool = parser_ast_size(parser_root);
    my_parser->p_root = std::malloc(my_parser->sz_mempool);
    my_parser->p_free = my_parser->p_root;

    my_parser->ast = parser_ast_dup(my_parser, parser_root, 1); /* 1: free the source parser_root */

    if ((char*)my_parser->p_root + my_parser->sz_mempool != (char*)my_parser->p_free) {
        amrex::Abort("amrex_parser_new: error in memory size");
    }

    parser_ast_optimize(my_parser->ast);

    return my_parser;
}